

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ecmult_const_tests(void)

{
  ecmult_const_mult_zero_one();
  ecmult_const_edges();
  ecmult_const_random_mult();
  ecmult_const_commutativity();
  ecmult_const_chain_multiply();
  ecmult_const_mult_xonly();
  return;
}

Assistant:

static void run_ecmult_const_tests(void) {
    ecmult_const_mult_zero_one();
    ecmult_const_edges();
    ecmult_const_random_mult();
    ecmult_const_commutativity();
    ecmult_const_chain_multiply();
    ecmult_const_mult_xonly();
}